

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbPush.c
# Opt level: O2

void Acb_NtkPushLogic(Acb_Ntk_t *p,int nLutSize,int fVerbose)

{
  int iVar1;
  Acb_ObjType_t AVar2;
  int iVar3;
  int i;
  int iVar4;
  uint uVar5;
  
  iVar1 = Acb_NtkNodeNum(p);
  Acb_NtkCreateFanout(p);
  iVar4 = 1;
  while( true ) {
    iVar3 = (p->vObjType).nSize;
    if (iVar3 <= iVar4) break;
    AVar2 = Acb_ObjType(p,iVar4);
    if (AVar2 != ABC_OPER_NONE) {
      iVar3 = Acb_ObjIsCio(p,iVar4);
      if (iVar3 == 0) {
        iVar3 = Acb_ObjFaninNum(p,iVar4);
        if (iVar3 == 0) {
          Acb_ObjRemoveConst(p,iVar4);
        }
      }
    }
    iVar4 = iVar4 + 1;
  }
  iVar4 = 1;
  while( true ) {
    if (iVar3 <= iVar4) break;
    AVar2 = Acb_ObjType(p,iVar4);
    if (AVar2 != ABC_OPER_NONE) {
      iVar3 = Acb_ObjIsCio(p,iVar4);
      if (iVar3 == 0) {
        iVar3 = Acb_ObjFaninNum(p,iVar4);
        if (iVar3 == 1) {
          Acb_ObjRemoveBufInv(p,iVar4);
        }
      }
    }
    iVar4 = iVar4 + 1;
    iVar3 = (p->vObjType).nSize;
  }
  uVar5 = 0;
  for (iVar4 = 2; iVar4 <= nLutSize; iVar4 = iVar4 + 1) {
    for (i = 1; i < iVar3; i = i + 1) {
      AVar2 = Acb_ObjType(p,i);
      if (AVar2 != ABC_OPER_NONE) {
        iVar3 = Acb_ObjIsCio(p,i);
        if (iVar3 == 0) {
          iVar3 = Acb_ObjFaninNum(p,i);
          if (iVar3 == iVar4) {
            uVar5 = uVar5 - 1;
            do {
              iVar3 = Acb_ObjPushToFanins(p,i,nLutSize);
              uVar5 = uVar5 + 1;
            } while (iVar3 != 0);
            iVar3 = Acb_ObjFaninNum(p,i);
            if (iVar3 == 1) {
              Acb_ObjRemoveBufInv(p,i);
            }
          }
        }
      }
      iVar3 = (p->vObjType).nSize;
    }
  }
  iVar4 = Acb_NtkNodeNum(p);
  printf("Saved %d nodes after %d pushes.\n",(ulong)(uint)(iVar1 - iVar4),(ulong)uVar5);
  return;
}

Assistant:

void Acb_NtkPushLogic( Acb_Ntk_t * p, int nLutSize, int fVerbose )
{
    int n = 0, iObj, nNodes = Acb_NtkNodeNum(p), nPushes = 0;
    Acb_NtkCreateFanout( p );  // fanout data structure
    Acb_NtkForEachNodeSupp( p, iObj, 0 )
        Acb_ObjRemoveConst( p, iObj );
    Acb_NtkForEachNodeSupp( p, iObj, 1 )
        Acb_ObjRemoveBufInv( p, iObj );
    for ( n = 2; n <= nLutSize; n++ )
        Acb_NtkForEachNodeSupp( p, iObj, n )
        {
            while ( Acb_ObjPushToFanins(p, iObj, nLutSize) )
                nPushes++;
            if ( Acb_ObjFaninNum(p, iObj) == 1 )
                Acb_ObjRemoveBufInv( p, iObj );
        }
    printf( "Saved %d nodes after %d pushes.\n", nNodes - Acb_NtkNodeNum(p), nPushes );
}